

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O3

bool cmPolicies::GetPolicyID(char *id,PolicyID *pid)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  long id_1;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  if (id == (char *)0x0) {
    __assert_fail("input",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmPolicies.cxx"
                  ,0x17,"bool stringToId(const char *, cmPolicies::PolicyID &)");
  }
  sVar3 = strlen(id);
  if (sVar3 == 7) {
    local_28._M_len = strlen(id);
    __str._M_str = "CMP";
    __str._M_len = 3;
    local_28._M_str = id;
    iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_28,0,3,__str);
    if (iVar2 != 0) {
      return false;
    }
    local_28._M_len = strlen(id);
    local_28._M_str = id;
    if ((local_28._M_len < 4) ||
       (__str_00._M_str = "0000", __str_00._M_len = 4,
       iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                         (&local_28,local_28._M_len - 4,4,__str_00), iVar2 != 0)) {
      lVar4 = 0;
      do {
        if (9 < (int)id[lVar4 + 3] - 0x30U) goto LAB_001c22a1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      bVar1 = cmStrToLong(id + 3,(long *)&local_28);
      if ((!bVar1) || (0x8e < (long)local_28._M_len)) goto LAB_001c22a1;
      *pid = (PolicyID)local_28._M_len;
    }
    else {
      *pid = CMP0000;
    }
    bVar1 = true;
  }
  else {
LAB_001c22a1:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool stringToId(const char* input, cmPolicies::PolicyID& pid)
{
  assert(input);
  if (strlen(input) != 7) {
    return false;
  }
  if (!cmHasLiteralPrefix(input, "CMP")) {
    return false;
  }
  if (cmHasLiteralSuffix(input, "0000")) {
    pid = cmPolicies::CMP0000;
    return true;
  }
  for (int i = 3; i < 7; ++i) {
    if (!isdigit(*(input + i))) {
      return false;
    }
  }
  long id;
  if (!cmStrToLong(input + 3, &id)) {
    return false;
  }
  if (id >= cmPolicies::CMPCOUNT) {
    return false;
  }
  pid = static_cast<cmPolicies::PolicyID>(id);
  return true;
}